

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::MapCacheIdsToPropertyIds(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint rootObjectLoadInlineCacheStart;
  uint uVar1;
  int iVar2;
  int iVar3;
  PropertyId propertyId;
  InlineCacheMap *pIVar4;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  Type pSVar6;
  undefined8 uVar7;
  RootObjectInlineCacheIdMap *pRVar8;
  Type pSVar9;
  code *pcVar10;
  bool bVar11;
  uint uVar12;
  FunctionBody *this_00;
  Type *pTVar13;
  ulong uVar14;
  undefined4 *puVar15;
  Type *pTVar16;
  int iVar17;
  ulong uVar18;
  NodeBase *pNVar19;
  uint rootObjectStoreInlineCacheStart;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *pSVar20;
  uint rootObjectLoadMethodInlineCacheStart;
  Type TVar21;
  uint uVar22;
  undefined1 local_88 [8];
  Iterator toStringIter;
  undefined1 local_48 [8];
  Iterator valueOfIter;
  
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  rootObjectLoadInlineCacheStart = funcInfo->inlineCacheCount;
  rootObjectLoadMethodInlineCacheStart =
       funcInfo->rootObjectLoadInlineCacheCount + rootObjectLoadInlineCacheStart;
  rootObjectStoreInlineCacheStart =
       funcInfo->rootObjectLoadMethodInlineCacheCount + rootObjectLoadMethodInlineCacheStart;
  uVar1 = funcInfo->rootObjectStoreInlineCacheCount;
  Js::FunctionBody::CreateCacheIdToPropertyIdMap
            (this_00,rootObjectLoadInlineCacheStart,rootObjectLoadMethodInlineCacheStart,
             rootObjectStoreInlineCacheStart,rootObjectStoreInlineCacheStart + uVar1,
             funcInfo->isInstInlineCacheCount);
  if (uVar1 + rootObjectStoreInlineCacheStart == 0) {
    return;
  }
  pIVar4 = funcInfo->inlineCacheMap;
  TVar21 = pIVar4->bucketCount;
  if (TVar21 != 0) {
    valueOfIter.current = (NodeBase *)__tls_get_addr(&PTR_01548f08);
    uVar14 = 0;
    do {
      iVar17 = pIVar4->buckets[uVar14];
      if (iVar17 != -1) {
        do {
          iVar2 = pIVar4->entries[iVar17].
                  super_DefaultHashedEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                  .
                  super_ValueEntry<JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>_>
                  .
                  super_KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                  .next;
          pBVar5 = pIVar4->entries[iVar17].
                   super_DefaultHashedEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                   .
                   super_ValueEntry<JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                   .value;
          uVar12 = pBVar5->bucketCount;
          if (uVar12 != 0) {
            uVar18 = 0;
            do {
              iVar17 = pBVar5->buckets[uVar18];
              if (iVar17 != -1) {
                do {
                  pSVar6 = pBVar5->entries;
                  iVar3 = *(int *)((long)&pSVar6[iVar17].
                                          super_DefaultHashedEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                          .
                                          super_KeyValueEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>
                                  + 8);
                  pSVar20 = *(SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> **)
                             &pSVar6[iVar17].
                              super_DefaultHashedEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                              .
                              super_KeyValueEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>
                  ;
                  if (pSVar20 != (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0)
                  {
                    propertyId = *(int *)((long)&pSVar6[iVar17].
                                                 super_DefaultHashedEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                                 .
                                                 super_KeyValueEntry<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>
                                         + 0xc);
                    toStringIter.current._4_4_ = iVar3;
                    local_48 = (undefined1  [8])pSVar20;
                    valueOfIter.list = pSVar20;
                    while( true ) {
                      if (valueOfIter.list ==
                          (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        pNVar19 = valueOfIter.current;
                        *(undefined4 *)&(valueOfIter.current)->next = 1;
                        bVar11 = Js::Throw::ReportAssert
                                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                            ,0x76,"(current != nullptr)","current != nullptr");
                        if (!bVar11) goto LAB_00807759;
                        *(undefined4 *)&pNVar19->next = 0;
                      }
                      pSVar20 = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
                                ((valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).
                                next;
                      iVar3 = toStringIter.current._4_4_;
                      if ((undefined1  [8])pSVar20 == local_48) break;
                      valueOfIter.list = pSVar20;
                      pTVar13 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::
                                Iterator::Data((Iterator *)local_48);
                      uVar7 = *(undefined8 *)&pTVar13->field_0;
                      uVar1 = (pTVar13->field_0).field_0.storeCacheId;
                      uVar22 = (uint)uVar7;
                      if (uVar22 != 0xffffffff) {
                        Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar22,propertyId);
                      }
                      uVar22 = (uint)((ulong)uVar7 >> 0x20);
                      if (uVar22 != 0xffffffff) {
                        Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar22,propertyId);
                      }
                      if (uVar1 != 0xffffffff) {
                        Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar1,propertyId);
                      }
                    }
                  }
                  iVar17 = iVar3;
                } while (iVar17 != -1);
                uVar12 = pBVar5->bucketCount;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < uVar12);
          }
          iVar17 = iVar2;
        } while (iVar2 != -1);
        TVar21 = pIVar4->bucketCount;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < TVar21);
  }
  pRVar8 = funcInfo->rootObjectLoadInlineCacheMap;
  uVar12 = pRVar8->bucketCount;
  if (uVar12 != 0) {
    pNVar19 = (NodeBase *)0x0;
    do {
      iVar17 = pRVar8->buckets[(long)pNVar19];
      if (iVar17 != -1) {
        do {
          valueOfIter.current = pNVar19;
          pSVar9 = pRVar8->entries;
          iVar2 = pSVar9[iVar17].
                  super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<int,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
          Js::FunctionBody::SetPropertyIdForCacheId
                    (this_00,pSVar9[iVar17].
                             super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .super_KeyValueEntry<int,_unsigned_int>.
                             super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                             .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value +
                             rootObjectLoadInlineCacheStart,
                     pSVar9[iVar17].
                     super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<int,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
          iVar17 = iVar2;
          pNVar19 = valueOfIter.current;
        } while (iVar2 != -1);
        uVar12 = pRVar8->bucketCount;
      }
      pNVar19 = (NodeBase *)((long)&pNVar19->next + 1);
    } while (pNVar19 < (NodeBase *)(ulong)uVar12);
  }
  pRVar8 = funcInfo->rootObjectLoadMethodInlineCacheMap;
  uVar12 = pRVar8->bucketCount;
  if (uVar12 != 0) {
    pNVar19 = (NodeBase *)0x0;
    do {
      iVar17 = pRVar8->buckets[(long)pNVar19];
      if (iVar17 != -1) {
        do {
          valueOfIter.current = pNVar19;
          pSVar9 = pRVar8->entries;
          iVar2 = pSVar9[iVar17].
                  super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<int,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
          Js::FunctionBody::SetPropertyIdForCacheId
                    (this_00,pSVar9[iVar17].
                             super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .super_KeyValueEntry<int,_unsigned_int>.
                             super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                             .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value +
                             rootObjectLoadMethodInlineCacheStart,
                     pSVar9[iVar17].
                     super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<int,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
          iVar17 = iVar2;
          pNVar19 = valueOfIter.current;
        } while (iVar2 != -1);
        uVar12 = pRVar8->bucketCount;
      }
      pNVar19 = (NodeBase *)((long)&pNVar19->next + 1);
    } while (pNVar19 < (NodeBase *)(ulong)uVar12);
  }
  pRVar8 = funcInfo->rootObjectStoreInlineCacheMap;
  uVar12 = pRVar8->bucketCount;
  if (uVar12 != 0) {
    pNVar19 = (NodeBase *)0x0;
    do {
      iVar17 = pRVar8->buckets[(long)pNVar19];
      if (iVar17 != -1) {
        do {
          valueOfIter.current = pNVar19;
          pSVar9 = pRVar8->entries;
          iVar2 = pSVar9[iVar17].
                  super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<int,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
          Js::FunctionBody::SetPropertyIdForCacheId
                    (this_00,pSVar9[iVar17].
                             super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .super_KeyValueEntry<int,_unsigned_int>.
                             super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                             .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value +
                             rootObjectStoreInlineCacheStart,
                     pSVar9[iVar17].
                     super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<int,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
          iVar17 = iVar2;
          pNVar19 = valueOfIter.current;
        } while (iVar2 != -1);
        uVar12 = pRVar8->bucketCount;
      }
      pNVar19 = (NodeBase *)((long)&pNVar19->next + 1);
    } while (pNVar19 < (NodeBase *)(ulong)uVar12);
  }
  pSVar20 = &funcInfo->valueOfStoreCacheIds;
  local_48 = (undefined1  [8])pSVar20;
  valueOfIter.list = pSVar20;
  puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if (pSVar20 == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar11) goto LAB_00807759;
      *puVar15 = 0;
      pSVar20 = valueOfIter.list;
    }
    valueOfIter.list =
         (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
         (pSVar20->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])valueOfIter.list == local_48) break;
    pTVar16 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    Js::FunctionBody::SetPropertyIdForCacheId(this_00,*pTVar16,0x18e);
    pSVar20 = valueOfIter.list;
  }
  valueOfIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
  local_88 = (undefined1  [8])&funcInfo->toStringStoreCacheIds;
  toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)local_88;
  do {
    if (toStringIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar11) {
LAB_00807759:
        pcVar10 = (code *)invalidInstructionException();
        (*pcVar10)();
      }
      *puVar15 = 0;
    }
    toStringIter.list =
         (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
         ((toStringIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])toStringIter.list == local_88) {
      toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
      Js::FunctionBody::VerifyCacheIdToPropertyIdMap(this_00);
      return;
    }
    pTVar16 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_88);
    Js::FunctionBody::SetPropertyIdForCacheId(this_00,*pTVar16,0x178);
  } while( true );
}

Assistant:

void ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo *funcInfo)
{
    Js::FunctionBody *functionBody = funcInfo->GetParsedFunctionBody();
    uint rootObjectLoadInlineCacheStart = funcInfo->GetInlineCacheCount();
    uint rootObjectLoadMethodInlineCacheStart = rootObjectLoadInlineCacheStart + funcInfo->GetRootObjectLoadInlineCacheCount();
    uint rootObjectStoreInlineCacheStart = rootObjectLoadMethodInlineCacheStart + funcInfo->GetRootObjectLoadMethodInlineCacheCount();
    uint totalFieldAccessInlineCacheCount = rootObjectStoreInlineCacheStart + funcInfo->GetRootObjectStoreInlineCacheCount();

    functionBody->CreateCacheIdToPropertyIdMap(rootObjectLoadInlineCacheStart, rootObjectLoadMethodInlineCacheStart,
        rootObjectStoreInlineCacheStart, totalFieldAccessInlineCacheCount, funcInfo->GetIsInstInlineCacheCount());

    if (totalFieldAccessInlineCacheCount == 0)
    {
        return;
    }

    funcInfo->inlineCacheMap->Map([functionBody](Js::RegSlot regSlot, FuncInfo::InlineCacheIdMap *inlineCacheIdMap)
    {
        inlineCacheIdMap->Map([functionBody](Js::PropertyId propertyId, FuncInfo::InlineCacheList* inlineCacheList)
        {
            if (inlineCacheList)
            {
                inlineCacheList->Iterate([functionBody, propertyId](InlineCacheUnit cacheUnit)
                {
                    CompileAssert(offsetof(InlineCacheUnit, cacheId) == offsetof(InlineCacheUnit, loadCacheId));
                    if (cacheUnit.loadCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadCacheId, propertyId);
                    }
                    if (cacheUnit.loadMethodCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadMethodCacheId, propertyId);
                    }
                    if (cacheUnit.storeCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.storeCacheId, propertyId);
                    }
                });
            }
        });
    });

    funcInfo->rootObjectLoadInlineCacheMap->Map([functionBody, rootObjectLoadInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectLoadMethodInlineCacheMap->Map([functionBody, rootObjectLoadMethodInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadMethodInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectStoreInlineCacheMap->Map([functionBody, rootObjectStoreInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectStoreInlineCacheStart, propertyId);
    });

    SListBase<uint>::Iterator valueOfIter(&funcInfo->valueOfStoreCacheIds);
    while (valueOfIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(valueOfIter.Data(), Js::PropertyIds::valueOf);
    }

    SListBase<uint>::Iterator toStringIter(&funcInfo->toStringStoreCacheIds);
    while (toStringIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(toStringIter.Data(), Js::PropertyIds::toString);
    }

#if DBG
    functionBody->VerifyCacheIdToPropertyIdMap();
#endif
}